

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O0

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  signal_attributes val;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  function<void_()> local_58;
  socklen_t local_24;
  sockaddr *psStack_20;
  handler_attributes attributes_local;
  handler_type *handler_local;
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
  *this_local;
  
  handler_local = (handler_type *)CONCAT44(in_register_00000034,__fd);
  local_24 = __len;
  psStack_20 = __addr;
  this_local = this;
  val = (**(code **)(*(long *)&(handler_local->super__Function_base)._M_functor + 0x30))();
  bVar1 = contains_flag<wigwag::signal_attributes>(val,connect_async_only);
  if (!bVar1) {
    std::function<void_()>::function(&local_58,(function<void_()> *)__addr);
    listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
    ::connect((listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
               *)this,__fd + 8,(sockaddr *)&local_58,local_24);
    std::function<void_()>::~function(&local_58);
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"The signal restrains connecting synchronous handlers!")
  ;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual token connect(handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_async_only))
                WIGWAG_THROW("The signal restrains connecting synchronous handlers!");

            return listenable_base::connect(std::move(handler), attributes);
        }